

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

size_t coll_seq_remove_all(coll_seq_t *seq,void *data)

{
  coll_seq_node_t *pcVar1;
  coll_seq_t *pcVar2;
  coll_seq_node_t *__ptr;
  coll_seq_node_t *pcVar3;
  coll_seq_node_t *pcVar4;
  size_t sVar5;
  
  if (seq->head == (coll_seq_node_t *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    __ptr = seq->head;
    pcVar3 = (coll_seq_node_t *)0x0;
    do {
      pcVar1 = __ptr->next;
      pcVar4 = __ptr;
      if (__ptr->data == data) {
        pcVar2 = (coll_seq_t *)&pcVar3->next;
        if (pcVar3 == (coll_seq_node_t *)0x0) {
          pcVar2 = seq;
        }
        pcVar2->head = pcVar1;
        free(__ptr);
        seq->len = seq->len - 1;
        sVar5 = sVar5 + 1;
        pcVar4 = pcVar3;
      }
      __ptr = pcVar1;
      pcVar3 = pcVar4;
    } while (pcVar1 != (coll_seq_node_t *)0x0);
  }
  return sVar5;
}

Assistant:

size_t coll_seq_remove_all(coll_seq_t *seq, void *data) {
    size_t count = 0;
    node_t *prev = NULL, *cur = seq->head;
    while (cur) {
        node_t *next = cur->next;
        if (cur->data == data) {
            if (!prev) {
                seq->head = next;
            } else {
                prev->next = next;
            }
            free(cur);
            --(seq->len);
            ++count;
        } else {
            prev = cur;
        }
        cur = next;
    }
    return count;
}